

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O2

void __thiscall
glcts::LayoutBindingBaseCase::setArg(LayoutBindingBaseCase *this,String *arg,String *value)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  allocator<char> local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (value->_M_string_length == 0) {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    local_58._M_string_length = 0;
    local_58.field_2._M_local_buf[0] = '\0';
    this_00 = &local_58;
    std::__cxx11::string::operator=((string *)arg,(string *)this_00);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38," ",&local_59);
    std::operator+(&local_58,value,&local_38);
    std::__cxx11::string::operator=((string *)arg,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    this_00 = &local_38;
  }
  std::__cxx11::string::~string((string *)this_00);
  return;
}

Assistant:

void setArg(String& arg, const String& value) const
	{
		if (!value.empty())
			arg = value + String(" ");
		else
			arg = String();
	}